

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c++
# Opt level: O1

void __thiscall
kj::_::GzipOutputContext::GzipOutputContext(GzipOutputContext *this,Maybe<int> *compressionLevel)

{
  int result;
  
  (this->ctx).next_in = (Bytef *)0x0;
  (this->ctx).avail_in = 0;
  (this->ctx).total_in = 0;
  (this->ctx).next_out = (Bytef *)0x0;
  (this->ctx).avail_out = 0;
  (this->ctx).total_out = 0;
  (this->ctx).msg = (char *)0x0;
  (this->ctx).state = (internal_state *)0x0;
  (this->ctx).zalloc = (alloc_func)0x0;
  (this->ctx).zfree = (free_func)0x0;
  (this->ctx).opaque = (voidpf)0x0;
  (this->ctx).data_type = 0;
  (this->ctx).adler = 0;
  (this->ctx).reserved = 0;
  if ((compressionLevel->ptr).isSet == true) {
    this->compressing = true;
    result = deflateInit2_(&this->ctx,(compressionLevel->ptr).field_1.value,8,0x1f,8,0,"1.2.11",0x70
                          );
  }
  else {
    this->compressing = false;
    result = inflateInit2_(&this->ctx,0x1f,"1.2.11",0x70);
  }
  if (result == 0) {
    return;
  }
  fail(this,result);
}

Assistant:

GzipOutputContext::GzipOutputContext(kj::Maybe<int> compressionLevel) {
  int initResult;

  KJ_IF_MAYBE(level, compressionLevel) {
    compressing = true;
    initResult =
      deflateInit2(&ctx, *level, Z_DEFLATED,
                   15 + 16,  // windowBits = 15 (maximum) + magic value 16 to ask for gzip.
                   8,        // memLevel = 8 (the default)
                   Z_DEFAULT_STRATEGY);
  } else {
    compressing = false;
    initResult = inflateInit2(&ctx, 15 + 16);
  }